

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void update_disp(void)

{
  int iVar1;
  int local_10;
  int local_c;
  int j;
  int i;
  
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    if (robots[local_c].status != 0) {
      plot_robot(local_c);
      robot_stat(local_c);
    }
    for (local_10 = 0; local_10 < 2; local_10 = local_10 + 1) {
      iVar1 = missiles[local_c][local_10].stat;
      if (iVar1 != 0) {
        if (iVar1 == 1) {
          plot_miss(local_c,local_10);
        }
        else if (iVar1 == 2) {
          plot_exp(local_c,local_10);
          count_miss(local_c,local_10);
        }
      }
    }
  }
  return;
}

Assistant:

void update_disp()
{
   int i, j;

  /* plot each live robot and update status */
  for (i = 0; i < MAXROBOTS; i++) {
    if (robots[i].status != DEAD) {
      plot_robot(i);
      robot_stat(i);
    }
    /* plot each missile */
    for (j = 0; j < MIS_ROBOT; j++) {
      switch (missiles[i][j].stat) {
	case AVAIL:
	  break;
	case FLYING:
	  plot_miss(i,j);
	  break;
	case EXPLODING:
	  plot_exp(i,j);
	  count_miss(i,j);
	  break;
	default:
	  break;
      }
    }
  }
}